

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator>::Lookup
          (PrimitiveDictionary<short,_int,_duckdb::ParquetCastOperator> *this,short *value)

{
  primitive_dictionary_entry_t *ppVar1;
  ulong uVar2;
  
  uVar2 = Hash<short>(*value);
  do {
    uVar2 = uVar2 & this->capacity_mask;
    ppVar1 = this->dictionary + uVar2;
    if (ppVar1->index == 0xffffffff) {
      return ppVar1;
    }
    uVar2 = uVar2 + 1;
  } while (ppVar1->value != *value);
  return ppVar1;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}